

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTexture2Tests.hpp
# Opt level: O1

void __thiscall
gl4cts::SparseTexture2LookupTestCase::FunctionToken::FunctionToken
          (FunctionToken *this,string *fname,string *fargs)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  pcVar2 = (fname->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar2,pcVar2 + fname->_M_string_length);
  (this->arguments)._M_dataplus._M_p = (pointer)&(this->arguments).field_2;
  pcVar2 = (fargs->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->arguments,pcVar2,pcVar2 + fargs->_M_string_length);
  p_Var1 = &(this->allowedTargets)._M_t._M_impl.super__Rb_tree_header;
  (this->allowedTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->allowedTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->allowedTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->allowedTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->allowedTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

FunctionToken(std::string fname, std::string fargs) : name(fname), arguments(fargs)
		{
		}